

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Osc::render(V2Osc *this,float *dest,int nsamples)

{
  long lVar1;
  
  switch(this->mode & 7) {
  case 0:
    return;
  case 1:
    renderTriSaw(this,dest,nsamples);
    return;
  case 2:
    renderPulse(this,dest,nsamples);
    return;
  case 3:
    renderSin(this,dest,nsamples);
    return;
  case 4:
    renderNoise(this,dest,nsamples);
    return;
  case 5:
    renderFMSin(this,dest,nsamples);
    return;
  case 6:
    lVar1 = 0x2be0;
    break;
  case 7:
    lVar1 = 0x34a0;
  }
  renderAux(this,dest,(StereoSample *)((long)this->inst->vcebuf + lVar1 + -0x20),nsamples);
  return;
}

Assistant:

void render(float *dest, int nsamples)
    {
        switch (mode & 7)
        {
        case OSC_OFF:     break;
        case OSC_TRI_SAW: renderTriSaw(dest, nsamples); break;
        case OSC_PULSE:   renderPulse(dest, nsamples); break;
        case OSC_SIN:     renderSin(dest, nsamples); break;
        case OSC_NOISE:   renderNoise(dest, nsamples); break;
        case OSC_FM_SIN:  renderFMSin(dest, nsamples); break;
        case OSC_AUXA:    renderAux(dest, inst->auxabuf, nsamples); break;
        case OSC_AUXB:    renderAux(dest, inst->auxbbuf, nsamples); break;
        }

        DEBUG_PLOT(this, dest, nsamples);
    }